

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O3

int Ver_FormulaParserFindVar(char *pString,Vec_Ptr_t *vNames)

{
  byte *pbVar1;
  size_t __size;
  uint uVar2;
  int iVar3;
  void **ppvVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  void *local_40;
  
  bVar6 = *pString;
  pcVar11 = pString;
  if (bVar6 == 0x5c) {
    pcVar12 = pString + 1;
    bVar6 = 0x5c;
    while ((bVar6 & 0xdf) != 0) {
      pbVar1 = (byte *)(pcVar11 + 1);
      pcVar11 = pcVar11 + 1;
      bVar6 = *pbVar1;
    }
  }
  else {
    while (((pcVar12 = pString, 0x3f < bVar6 ||
            ((0x8400134300002601U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) &&
           ((0x20 < bVar6 - 0x5e || ((0x1c0000001U >> ((ulong)(bVar6 - 0x5e) & 0x3f) & 1) == 0)))))
    {
      bVar6 = pcVar11[1];
      pcVar11 = pcVar11 + 1;
    }
  }
  iVar7 = (int)pcVar11 - (int)pcVar12;
  uVar2 = vNames->nSize;
  uVar10 = (ulong)uVar2;
  if ((int)uVar2 < 2) {
    uVar5 = 0;
  }
  else {
    uVar5 = uVar2 >> 1;
    uVar9 = 1;
    uVar13 = 0;
    do {
      if (uVar10 <= uVar9 - 1) {
LAB_003571dd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (*(int *)(vNames->pArray + (uVar9 - 1)) == iVar7) {
        if (uVar10 <= uVar9) goto LAB_003571dd;
        iVar3 = strncmp(pcVar12,(char *)vNames->pArray[uVar9],(long)iVar7);
        if (iVar3 == 0) {
          return (int)uVar13;
        }
      }
      uVar13 = uVar13 + 1;
      uVar9 = uVar9 + 2;
    } while (uVar5 != uVar13);
  }
  local_40 = (void *)(long)iVar7;
  uVar8 = vNames->nCap;
  if (uVar2 == uVar8) {
    if ((int)uVar2 < 0x10) {
      if (vNames->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vNames->pArray,0x80);
      }
      vNames->pArray = ppvVar4;
      vNames->nCap = 0x10;
      uVar8 = 0x10;
    }
    else {
      uVar8 = uVar2 * 2;
      if (vNames->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(uVar10 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vNames->pArray,uVar10 << 4);
      }
      vNames->pArray = ppvVar4;
      vNames->nCap = uVar8;
    }
  }
  else {
    ppvVar4 = vNames->pArray;
  }
  iVar7 = vNames->nSize;
  vNames->nSize = iVar7 + 1U;
  ppvVar4[iVar7] = local_40;
  if (iVar7 + 1U == uVar8) {
    if (iVar7 < 0xf) {
      if (vNames->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vNames->pArray,0x80);
      }
      vNames->pArray = ppvVar4;
      vNames->nCap = 0x10;
    }
    else {
      __size = (ulong)(uVar8 * 2) * 8;
      if (vNames->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(__size);
      }
      else {
        ppvVar4 = (void **)realloc(vNames->pArray,__size);
      }
      vNames->pArray = ppvVar4;
      vNames->nCap = uVar8 * 2;
    }
  }
  else {
    ppvVar4 = vNames->pArray;
  }
  iVar7 = vNames->nSize;
  vNames->nSize = iVar7 + 1;
  ppvVar4[iVar7] = pcVar12;
  return uVar5;
}

Assistant:

int Ver_FormulaParserFindVar( char * pString, Vec_Ptr_t * vNames )
{
    char * pTemp, * pTemp2;
    int nLength, nLength2, i;
    // start the string
    pTemp = pString;
    // find the end of the string delimited by other characters
    if ( *pTemp == '\\' )
    {
        pString++;
        while ( *pTemp && *pTemp != ' ' )
            pTemp++;
    }
    else
    {
        while ( *pTemp && *pTemp != ' ' && *pTemp != '\t' && *pTemp != '\r' && *pTemp != '\n' && *pTemp != ',' && *pTemp != '}' && 
                *pTemp != VER_PARSE_SYM_OPEN && *pTemp != VER_PARSE_SYM_CLOSE && 
                *pTemp != VER_PARSE_SYM_NEGBEF1 && *pTemp != VER_PARSE_SYM_NEGBEF2 && 
                *pTemp != VER_PARSE_SYM_AND && *pTemp != VER_PARSE_SYM_OR && *pTemp != VER_PARSE_SYM_XOR && 
                *pTemp != VER_PARSE_SYM_MUX1 && *pTemp != VER_PARSE_SYM_MUX2 )
                pTemp++;
    }
    // look for this string in the array
    nLength = pTemp - pString;
    for ( i = 0; i < Vec_PtrSize(vNames)/2; i++ )
    {
        nLength2 = (int)(ABC_PTRUINT_T)Vec_PtrEntry( vNames, 2*i + 0 );
        if ( nLength2 != nLength )
            continue;
        pTemp2   = (char *)Vec_PtrEntry( vNames, 2*i + 1 );
        if ( strncmp( pString, pTemp2, nLength ) )
            continue;
        return i;
    }
    // could not find - add and return the number
    Vec_PtrPush( vNames, (void *)(ABC_PTRUINT_T)nLength );
    Vec_PtrPush( vNames, pString );
    return i;
}